

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::resize
          (vector<double,_pstd::pmr::polymorphic_allocator<double>_> *this,size_type n)

{
  double *pdVar1;
  ulong uVar2;
  
  if (n < this->nStored) {
    if (n == 0) {
      pmr::polymorphic_allocator<double>::deallocate_object<double>
                (&this->alloc,this->ptr,this->nAlloc);
      this->ptr = (double *)0x0;
      this->nAlloc = 0;
    }
  }
  else if (this->nStored < n) {
    reserve(this,n);
    pdVar1 = this->ptr;
    for (uVar2 = this->nStored; uVar2 < n; uVar2 = uVar2 + 1) {
      pdVar1[uVar2] = 0.0;
    }
  }
  this->nStored = n;
  return;
}

Assistant:

void resize(size_type n) {
        if (n < size()) {
            for (size_t i = n; i < size(); ++i)
                alloc.destroy(ptr + i);
            if (n == 0) {
                alloc.deallocate_object(ptr, nAlloc);
                ptr = nullptr;
                nAlloc = 0;
            }
        } else if (n > size()) {
            reserve(n);
            for (size_t i = nStored; i < n; ++i)
                alloc.construct(ptr + i);
        }
        nStored = n;
    }